

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  int line;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar2;
  bool local_45;
  anon_enum_32 local_44;
  LogMessageFatal local_40;
  
  local_45 = packed;
  pVar2 = Insert(this,number);
  pEVar1 = pVar2.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_40.super_LogMessage.errno_saver_.saved_errno_ = pEVar1->is_repeated ^ CPPTYPE_INT32;
    local_44 = REPEATED_FIELD;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                            ((anon_enum_32 *)&local_40,&local_44,
                             "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_40.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar1->type);
      local_44 = 8;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                              ((CppType *)&local_40,&local_44,
                               "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                                (&pEVar1->is_packed,&local_45,"extension->is_packed == packed");
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          line = 0x238;
          goto LAB_00238739;
        }
        this_00 = pEVar1->field_0;
        goto LAB_002386e3;
      }
    }
    line = 0x237;
  }
  else {
    pEVar1->type = type;
    local_40.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(type);
    local_44 = 8;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_40,&local_44,
                             "cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pEVar1->is_repeated = true;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      pEVar1->is_packed = packed;
      this_00 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(this->arena_);
      pEVar1->field_0 = this_00;
LAB_002386e3:
      RepeatedField<int>::Add((RepeatedField<int> *)this_00,value);
      return;
    }
    line = 0x230;
  }
LAB_00238739:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = packed;
    extension->ptr.repeated_enum_value =
        Arena::Create<RepeatedField<int>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    ABSL_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->ptr.repeated_enum_value->Add(value);
}